

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::compute_persistence
          (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,unsigned_short min_dimension,unsigned_short max_dimension,
          bool check_euler_characteristic)

{
  int iVar1;
  iterator __position;
  long *plVar2;
  ostream *poVar3;
  pointer puVar4;
  undefined7 in_register_00000009;
  long lVar5;
  ulong uVar6;
  long lVar7;
  undefined6 in_register_00000032;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  unsigned_long local_38;
  
  uVar8 = CONCAT71(in_register_00000009,check_euler_characteristic) & 0xffffffff;
  compute_zeroth_persistence(this,min_dimension,max_dimension);
  compute_higher_persistence(this,min_dimension,max_dimension);
  (*this->output->_vptr_output_t[4])(this->output,uVar8);
  if (((((int)CONCAT62(in_register_00000032,min_dimension) == 0) && (max_dimension == 0xffff)) &&
      ((char)uVar8 != '\0')) && (this->max_entries == 0xffffffffffffffff)) {
    puVar4 = (this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(this->complex->cell_count).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
    lVar7 = 0;
    uVar8 = 0;
    iVar11 = 0;
    do {
      iVar1 = *(int *)((long)puVar4 + (lVar7 >> 0x1d));
      iVar9 = -iVar1;
      if ((uVar8 & 1) == 0) {
        iVar9 = iVar1;
      }
      iVar11 = iVar11 + iVar9;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x100000000;
    } while (lVar5 + (ulong)(lVar5 == 0) != uVar8);
    if (this->print_betti_numbers_to_console != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The Euler characteristic is given by: ",0x26);
      plVar2 = (long *)std::ostream::operator<<(&std::cout,iVar11);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
    }
    if (iVar11 != this->euler_characteristic) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR: The homological Euler characteristic (which is ",0x36
                );
      poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,this->euler_characteristic);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,") differs from the cellular Euler characteristic (which is ",0x3b);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"), apparently there is an error in the program.",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  uVar8 = (ulong)min_dimension;
  uVar10 = (ulong)max_dimension + 1;
  puVar4 = (this->complex->cell_count).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->complex->cell_count).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar4 >> 3) - 1;
  if (uVar10 < uVar6) {
    uVar6 = uVar10;
  }
  if ((uint)min_dimension < (uint)uVar6) {
    do {
      local_38 = (unsigned_long)(int)puVar4[uVar8];
      __position._M_current =
           (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&this->cell_count,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar8 = uVar8 + 1;
      puVar4 = (this->complex->cell_count).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->complex->cell_count).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar4 >> 3) - 1;
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
    } while (uVar8 < uVar6);
  }
  return;
}

Assistant:

void compute_persistence(unsigned short min_dimension = 0,
	                         unsigned short max_dimension = std::numeric_limits<unsigned short>::max(),
	                         bool check_euler_characteristic = true) {
		compute_zeroth_persistence(min_dimension, max_dimension);
		compute_higher_persistence(min_dimension, max_dimension);
		complex.finished();
		output->finished(check_euler_characteristic);

		// Sanity check whether there were any problems computing the homology
		bool computed_full_homology = min_dimension == 0 && max_dimension == std::numeric_limits<unsigned short>::max();
		if (check_euler_characteristic && computed_full_homology && max_entries == std::numeric_limits<size_t>::max()) {
			index_t cell_euler_characteristic = 0;
			for (size_t i = 0; i <= complex.top_dimension(); i++) {
				cell_euler_characteristic += (i % 2 == 1 ? -1 : 1) * index_t(complex.number_of_cells(index_t(i)));
			}

			if (print_betti_numbers_to_console)
				std::cout << "The Euler characteristic is given by: " << cell_euler_characteristic << std::endl;

			if (cell_euler_characteristic != euler_characteristic) {
				std::cerr << "ERROR: The homological Euler characteristic (which is " << euler_characteristic
				          << ") differs from the cellular Euler characteristic (which is " << cell_euler_characteristic
				          << "), apparently there is an error in the program." << std::endl;
			}
		}

#ifdef RETRIEVE_PERSISTENCE
		for (size_t i = min_dimension; i < std::min(complex.top_dimension(), (size_t)max_dimension + 1); i++) {
			cell_count.push_back(index_t(complex.number_of_cells(index_t(i))));
		}
#endif
	}